

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

bool __thiscall SkipList::insertElement(SkipList *this,int value)

{
  value_type pEVar1;
  int iVar2;
  reference ppEVar3;
  Element *this_00;
  int local_6c;
  int local_68;
  int i_2;
  int i_1;
  int new_height;
  value_type pEStack_58;
  int i;
  Element *p;
  allocator<SkipList::Element_*> local_39;
  undefined1 local_38 [8];
  vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> update;
  int value_local;
  SkipList *this_local;
  
  iVar2 = this->MAX_HEIGHT;
  update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = value;
  std::allocator<SkipList::Element_*>::allocator(&local_39);
  std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::vector
            ((vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *)local_38,
             (long)(iVar2 + 1),&local_39);
  std::allocator<SkipList::Element_*>::~allocator(&local_39);
  pEStack_58 = &this->head;
  for (new_height = this->height; -1 < new_height; new_height = new_height + -1) {
    while (ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::
                     operator[](&pEStack_58->next,(long)new_height),
          (*ppEVar3)->value <
          update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                          (&pEStack_58->next,(long)new_height);
      pEStack_58 = *ppEVar3;
    }
    ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                        ((vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *)
                         local_38,(long)new_height);
    *ppEVar3 = pEStack_58;
  }
  ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                      (&pEStack_58->next,0);
  if ((*ppEVar3)->value ==
      update.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = randomHeight(this);
    if (this->height < iVar2) {
      local_68 = this->height;
      while (local_68 = local_68 + 1, local_68 <= iVar2) {
        ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                            ((vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *)
                             local_38,(long)local_68);
        *ppEVar3 = &this->head;
      }
      this->height = iVar2;
    }
    this_00 = (Element *)operator_new(0x20);
    Element::Element(this_00,update.
                             super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar2);
    for (local_6c = 0; local_6c <= iVar2; local_6c = local_6c + 1) {
      ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                          ((vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *)
                           local_38,(long)local_6c);
      ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                          (&(*ppEVar3)->next,(long)local_6c);
      pEVar1 = *ppEVar3;
      ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                          (&this_00->next,(long)local_6c);
      *ppEVar3 = pEVar1;
      ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                          ((vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *)
                           local_38,(long)local_6c);
      ppEVar3 = std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::operator[]
                          (&(*ppEVar3)->next,(long)local_6c);
      *ppEVar3 = this_00;
    }
    this_local._7_1_ = true;
  }
  std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::~vector
            ((vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool SkipList::insertElement(int value) {
    std::vector<Element *> update((unsigned long long) (MAX_HEIGHT + 1));
    Element *p = &head;

    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
        update[i] = p;
    }
    p = p->next[0];

    if (p->value == value) {
        return false;    // key x exists already in list
    }

    int new_height = randomHeight();
    if (new_height > height) {  // link new Element to head, adjust list height
        for (int i = height + 1; i <= new_height; ++i) {
            update[i] = &head;
        }
        height = new_height;
    }

    // create new Element with height new_height and key x
    p = new Element(value, new_height);

    // insert p into level i lists immediately after Element update[i]
    for (int i = 0; i <= new_height; ++i) {
        p->next[i] = update[i]->next[i];
        update[i]->next[i] = p;
    }
    return true;
}